

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumbAddSpecialReg(MCInst *Inst,uint16_t Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint16_t uVar3;
  DecodeStatus In;
  uint uVar4;
  uint imm;
  uint dst;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint16_t Insn_local;
  MCInst *Inst_local;
  
  imm = 3;
  _dst = Decoder;
  Decoder_local = (void *)Address;
  Address_local._6_2_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_2(Insn,8,3);
  uVar3 = fieldFromInstruction_2(Address_local._6_2_,0,8);
  In = DecodetGPRRegisterClass(pMStack_18,(uint)uVar2,(uint64_t)Decoder_local,_dst);
  _Var1 = Check(&imm,In);
  if (_Var1) {
    uVar4 = MCInst_getOpcode(pMStack_18);
    if (uVar4 == 0xa82) {
      MCOperand_CreateReg0(pMStack_18,0xc);
    }
    else if (uVar4 != 0xa88) {
      return MCDisassembler_Fail;
    }
    MCOperand_CreateImm0(pMStack_18,(ulong)uVar3);
    Inst_local._4_4_ = imm;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeThumbAddSpecialReg(MCInst *Inst, uint16_t Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned dst = fieldFromInstruction_2(Insn, 8, 3);
	unsigned imm = fieldFromInstruction_2(Insn, 0, 8);

	if (!Check(&S, DecodetGPRRegisterClass(Inst, dst, Address, Decoder)))
		return MCDisassembler_Fail;

	switch(MCInst_getOpcode(Inst)) {
		default:
			return MCDisassembler_Fail;
		case ARM_tADR:
			break; // tADR does not explicitly represent the PC as an operand.
		case ARM_tADDrSPi:
			MCOperand_CreateReg0(Inst, ARM_SP);
			break;
	}

	MCOperand_CreateImm0(Inst, imm);
	return S;
}